

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBox2dBox2dCollisionAlgorithm.cpp
# Opt level: O0

btScalar FindMaxSeparation(int *edgeIndex,btBox2dShape *poly1,btTransform *xf1,btBox2dShape *poly2,
                          btTransform *xf2)

{
  int iVar1;
  int iVar2;
  btVector3 *pbVar3;
  long lVar4;
  btBox2dShape *in_RCX;
  btTransform *in_RDX;
  btBox2dShape *in_RSI;
  int *in_RDI;
  btBox2dShape *in_R8;
  btScalar bVar5;
  btScalar bVar6;
  btVector3 bVar7;
  int increment;
  btScalar bestSeparation;
  int bestEdge;
  btScalar sNext;
  int nextEdge;
  btScalar sPrev;
  int prevEdge;
  btScalar s;
  btScalar maxDot;
  int edge;
  btVector3 dLocal1;
  btVector3 d;
  btVector3 *normals1;
  int count1;
  btVector3 *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  btTransform *array;
  btVector3 *this;
  int local_d8;
  float local_d4;
  int local_d0;
  int local_b4;
  btVector3 local_b0;
  btMatrix3x3 *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffffc8;
  btBox2dShape *poly1_00;
  btScalar local_4;
  
  iVar2 = btBox2dShape::getVertexCount(in_RSI);
  pbVar3 = btBox2dShape::getNormals(in_RSI);
  poly1_00 = in_R8;
  btBox2dShape::getCentroid(in_RCX);
  btTransform::operator*
            ((btTransform *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffef8);
  array = in_RDX;
  btBox2dShape::getCentroid(in_RSI);
  btTransform::operator*
            ((btTransform *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffef8);
  bVar7 = operator-((btVector3 *)in_R8,
                    (btVector3 *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  btTransform::getBasis(in_RDX);
  this = &local_b0;
  btMatrix3x3::transpose(in_stack_ffffffffffffff60);
  operator*((btMatrix3x3 *)in_R8,
            (btVector3 *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  local_b4 = 0;
  if (0 < iVar2) {
    lVar4 = btVector3::maxDot(this,(btVector3 *)array,(long)in_R8,
                              (btScalar *)
                              CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    local_b4 = (int)lVar4;
  }
  bVar5 = EdgeSeparation(poly1_00,(btTransform *)CONCAT44(iVar2,in_stack_ffffffffffffffc8),
                         (int)((ulong)pbVar3 >> 0x20),bVar7.m_floats._8_8_,bVar7.m_floats._0_8_);
  local_4 = bVar5;
  if (bVar5 <= 0.0) {
    iVar1 = iVar2;
    if (-1 < local_b4 + -1) {
      iVar1 = local_b4;
    }
    bVar6 = EdgeSeparation(poly1_00,(btTransform *)CONCAT44(iVar2,in_stack_ffffffffffffffc8),
                           (int)((ulong)pbVar3 >> 0x20),bVar7.m_floats._8_8_,bVar7.m_floats._0_8_);
    local_4 = bVar6;
    if (bVar6 <= 0.0) {
      if (local_b4 + 1 < iVar2) {
        local_d0 = local_b4 + 1;
      }
      else {
        local_d0 = 0;
      }
      local_d4 = EdgeSeparation(poly1_00,(btTransform *)CONCAT44(iVar2,in_stack_ffffffffffffffc8),
                                (int)((ulong)pbVar3 >> 0x20),bVar7.m_floats._8_8_,
                                bVar7.m_floats._0_8_);
      local_4 = local_d4;
      if (local_d4 <= 0.0) {
        if ((bVar6 <= bVar5) || (bVar6 <= local_d4)) {
          if (local_d4 <= bVar5) {
            *in_RDI = local_b4;
            return bVar5;
          }
          local_d8 = 1;
        }
        else {
          local_d8 = -1;
          local_d4 = bVar6;
          local_d0 = iVar1 + -1;
        }
        while( true ) {
          if (local_d8 == -1) {
            local_b4 = iVar2;
            if (-1 < local_d0 + -1) {
              local_b4 = local_d0;
            }
            local_b4 = local_b4 + -1;
          }
          else if (local_d0 + 1 < iVar2) {
            local_b4 = local_d0 + 1;
          }
          else {
            local_b4 = 0;
          }
          bVar5 = EdgeSeparation(poly1_00,(btTransform *)CONCAT44(iVar2,in_stack_ffffffffffffffc8),
                                 (int)((ulong)pbVar3 >> 0x20),bVar7.m_floats._8_8_,
                                 bVar7.m_floats._0_8_);
          if (0.0 < bVar5) {
            return bVar5;
          }
          if (bVar5 <= local_d4) break;
          local_d4 = bVar5;
          local_d0 = local_b4;
        }
        *in_RDI = local_d0;
        local_4 = local_d4;
      }
    }
  }
  return local_4;
}

Assistant:

static btScalar FindMaxSeparation(int* edgeIndex,
								 const btBox2dShape* poly1, const btTransform& xf1,
								 const btBox2dShape* poly2, const btTransform& xf2)
{
	int count1 = poly1->getVertexCount();
	const btVector3* normals1 = poly1->getNormals();

	// Vector pointing from the centroid of poly1 to the centroid of poly2.
	btVector3 d = b2Mul(xf2, poly2->getCentroid()) - b2Mul(xf1, poly1->getCentroid());
	btVector3 dLocal1 = b2MulT(xf1.getBasis(), d);

	// Find edge normal on poly1 that has the largest projection onto d.
	int edge = 0;
    btScalar maxDot;
    if( count1 > 0 )
        edge = (int) dLocal1.maxDot( normals1, count1, maxDot);

	// Get the separation for the edge normal.
	btScalar s = EdgeSeparation(poly1, xf1, edge, poly2, xf2);
	if (s > 0.0f)
	{
		return s;
	}

	// Check the separation for the previous edge normal.
	int prevEdge = edge - 1 >= 0 ? edge - 1 : count1 - 1;
	btScalar sPrev = EdgeSeparation(poly1, xf1, prevEdge, poly2, xf2);
	if (sPrev > 0.0f)
	{
		return sPrev;
	}

	// Check the separation for the next edge normal.
	int nextEdge = edge + 1 < count1 ? edge + 1 : 0;
	btScalar sNext = EdgeSeparation(poly1, xf1, nextEdge, poly2, xf2);
	if (sNext > 0.0f)
	{
		return sNext;
	}

	// Find the best edge and the search direction.
	int bestEdge;
	btScalar bestSeparation;
	int increment;
	if (sPrev > s && sPrev > sNext)
	{
		increment = -1;
		bestEdge = prevEdge;
		bestSeparation = sPrev;
	}
	else if (sNext > s)
	{
		increment = 1;
		bestEdge = nextEdge;
		bestSeparation = sNext;
	}
	else
	{
		*edgeIndex = edge;
		return s;
	}

	// Perform a local search for the best edge normal.
	for ( ; ; )
	{
		if (increment == -1)
			edge = bestEdge - 1 >= 0 ? bestEdge - 1 : count1 - 1;
		else
			edge = bestEdge + 1 < count1 ? bestEdge + 1 : 0;

		s = EdgeSeparation(poly1, xf1, edge, poly2, xf2);
		if (s > 0.0f)
		{
			return s;
		}

		if (s > bestSeparation)
		{
			bestEdge = edge;
			bestSeparation = s;
		}
		else
		{
			break;
		}
	}

	*edgeIndex = bestEdge;
	return bestSeparation;
}